

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_thread_join(void *p_thr)

{
  int iVar1;
  
  iVar1 = -1;
  if ((p_thr != (void *)0x0) && (*p_thr != 0)) {
    iVar1 = 0;
    pthread_join(*p_thr,(void **)0x0);
    *(undefined8 *)p_thr = 0;
    free(p_thr);
  }
  return iVar1;
}

Assistant:

int __attribute__((weak)) fio_thread_join(void *p_thr) {
  if (!p_thr || !(*((pthread_t *)p_thr)))
    return -1;
  pthread_join(*((pthread_t *)p_thr), NULL);
  *((pthread_t *)p_thr) = (pthread_t)NULL;
  free(p_thr);
  return 0;
}